

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::setState
          (VertexArrayObjectTest *this,VertexArrayState *state)

{
  GLint size;
  pointer pAVar1;
  GLenum GVar2;
  int iVar3;
  int attribNdx;
  GLuint index;
  long lVar4;
  char *pcVar5;
  long lVar6;
  
  glwBindBuffer(0x8893,(this->m_buffers).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[state->elementArrayBuffer]);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_buffers[state.elementArrayBuffer])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x224);
  lVar6 = 0;
  lVar4 = 0;
  while( true ) {
    pAVar1 = (state->attributes).
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(state->attributes).
                     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x24) <= lVar4)
    break;
    glwBindBuffer(0x8892,(this->m_buffers).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [*(int *)((long)&pAVar1->bufferNdx + lVar6)]);
    GVar2 = glwGetError();
    glu::checkError(GVar2,
                    "glBindBuffer(GL_ARRAY_BUFFER, m_buffers[state.attributes[attribNdx].bufferNdx])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x228);
    index = (GLuint)lVar4;
    if ((&((state->attributes).
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start)->enabled)[lVar6] == '\0') {
      glwDisableVertexAttribArray(index);
      GVar2 = glwGetError();
      pcVar5 = "glDisableVertexAttribArray(attribNdx)";
      iVar3 = 0x22c;
    }
    else {
      glwEnableVertexAttribArray(index);
      GVar2 = glwGetError();
      pcVar5 = "glEnableVertexAttribArray(attribNdx)";
      iVar3 = 0x22a;
    }
    glu::checkError(GVar2,pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,iVar3);
    pAVar1 = (state->attributes).
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_start;
    size = *(GLint *)((long)&pAVar1->size + lVar6);
    GVar2 = *(GLenum *)((long)&pAVar1->type + lVar6);
    if ((&pAVar1->integer)[lVar6] == '\0') {
      glwVertexAttribPointer
                (index,size,GVar2,(&pAVar1->normalized)[lVar6],
                 *(GLsizei *)((long)&pAVar1->stride + lVar6),
                 (void *)(long)*(int *)((long)&pAVar1->offset + lVar6));
      GVar2 = glwGetError();
      pcVar5 = 
      "glVertexAttribPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].normalized, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset))"
      ;
      iVar3 = 0x231;
    }
    else {
      glwVertexAttribIPointer
                (index,size,GVar2,*(GLsizei *)((long)&pAVar1->stride + lVar6),
                 (void *)(long)*(int *)((long)&pAVar1->offset + lVar6));
      GVar2 = glwGetError();
      pcVar5 = 
      "glVertexAttribIPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset))"
      ;
      iVar3 = 0x22f;
    }
    glu::checkError(GVar2,pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,iVar3);
    glwVertexAttribDivisor
              (index,*(GLuint *)
                      ((long)&((state->attributes).
                               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                               ._M_impl.super__Vector_impl_data._M_start)->divisor + lVar6));
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glVertexAttribDivisor(attribNdx, state.attributes[attribNdx].divisor)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x233);
    lVar4 = lVar4 + 1;
    lVar6 = lVar6 + 0x24;
  }
  return;
}

Assistant:

void VertexArrayObjectTest::setState (const VertexArrayState& state)
{
	GLU_CHECK_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_buffers[state.elementArrayBuffer]));

	for (int attribNdx = 0; attribNdx < (int)state.attributes.size(); attribNdx++)
	{
		GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, m_buffers[state.attributes[attribNdx].bufferNdx]));
		if (state.attributes[attribNdx].enabled)
			GLU_CHECK_CALL(glEnableVertexAttribArray(attribNdx));
		else
			GLU_CHECK_CALL(glDisableVertexAttribArray(attribNdx));

		if (state.attributes[attribNdx].integer)
			GLU_CHECK_CALL(glVertexAttribIPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset)));
		else
			GLU_CHECK_CALL(glVertexAttribPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].normalized, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset)));

		GLU_CHECK_CALL(glVertexAttribDivisor(attribNdx, state.attributes[attribNdx].divisor));
	}
}